

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtinfo.cpp
# Opt level: O3

void VirtualTableRegistry::Add(INT_PTR vtable,LPCSTR className)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (299 < m_knownVtableCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/vtinfo.cpp"
                       ,0xf,"(m_knownVtableCount < 300)","m_knownVtableCount < MAX_KNOWN_VTABLES");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    if (299 < m_knownVtableCount) {
      return;
    }
  }
  m_knownVtables[m_knownVtableCount].vtable = vtable;
  m_knownVtables[m_knownVtableCount].className = className;
  m_knownVtableCount = m_knownVtableCount + 1;
  return;
}

Assistant:

void VirtualTableRegistry::Add(INT_PTR vtable, LPCSTR className)
{
    Assert(m_knownVtableCount < MAX_KNOWN_VTABLES);
    if (m_knownVtableCount < MAX_KNOWN_VTABLES)
    {
        m_knownVtables[m_knownVtableCount].vtable = vtable;
        m_knownVtables[m_knownVtableCount].className = className;
        ++m_knownVtableCount;
    }
}